

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersector1<4,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceIntersector1>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 (*pauVar7) [16];
  byte bVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  InstancePrimitive *prim;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  vint4 bi_1;
  undefined1 auVar22 [16];
  undefined4 uVar23;
  undefined1 auVar24 [16];
  vint4 bi;
  undefined1 auVar25 [16];
  vint4 ai;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  Precalculations pre;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1029;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  ulong local_ff0;
  ulong local_fe8;
  RayHit *local_fe0;
  RayQueryContext *local_fd8;
  long local_fd0;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  ulong uVar12;
  
  local_fd8 = context;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return;
  }
  pauVar18 = (undefined1 (*) [16])local_f68;
  uStack_f70 = 0;
  auVar5 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
  auVar24 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
  aVar2 = (ray->super_RayK<1>).dir.field_0;
  auVar27._8_4_ = 0x7fffffff;
  auVar27._0_8_ = 0x7fffffff7fffffff;
  auVar27._12_4_ = 0x7fffffff;
  auVar22 = vandps_avx((undefined1  [16])aVar2,auVar27);
  auVar29._8_4_ = 0x219392ef;
  auVar29._0_8_ = 0x219392ef219392ef;
  auVar29._12_4_ = 0x219392ef;
  auVar22 = vcmpps_avx(auVar22,auVar29,1);
  auVar22 = vblendvps_avx((undefined1  [16])aVar2,auVar29,auVar22);
  auVar27 = vrcpps_avx(auVar22);
  auVar30._8_4_ = 0x3f800000;
  auVar30._0_8_ = 0x3f8000003f800000;
  auVar30._12_4_ = 0x3f800000;
  auVar22 = vfnmadd231ps_fma(auVar30,auVar27,auVar22);
  auVar29 = vfmadd132ps_fma(auVar22,auVar27,auVar27);
  local_fa8 = auVar29._0_4_;
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  auVar22 = vmovshdup_avx(auVar29);
  local_fb8 = vshufps_avx(auVar29,auVar29,0x55);
  auVar27 = vshufpd_avx(auVar29,auVar29,1);
  auVar32._0_4_ = local_fa8 * (ray->super_RayK<1>).org.field_0.m128[0];
  auVar32._4_4_ = auVar29._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
  auVar32._8_4_ = auVar29._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
  auVar32._12_4_ = auVar29._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
  local_fc8 = vshufps_avx(auVar29,auVar29,0xaa);
  auVar29 = vshufps_avx(auVar32,auVar32,0x55);
  auVar30 = vshufps_avx(auVar32,auVar32,0xaa);
  uVar15 = (ulong)(local_fa8 < 0.0) << 4;
  uVar16 = (ulong)(auVar22._0_4_ < 0.0) << 4 | 0x20;
  uVar19 = (ulong)(auVar27._0_4_ < 0.0) << 4 | 0x40;
  uVar14 = uVar15 ^ 0x10;
  uVar20 = uVar16 ^ 0x10;
  auVar22._0_4_ = auVar24._0_4_;
  auVar22._4_4_ = auVar22._0_4_;
  auVar22._8_4_ = auVar22._0_4_;
  auVar22._12_4_ = auVar22._0_4_;
  local_1008 = -auVar32._0_4_;
  fStack_1004 = -auVar32._0_4_;
  fStack_1000 = -auVar32._0_4_;
  fStack_ffc = -auVar32._0_4_;
  local_1018._0_8_ = auVar29._0_8_ ^ 0x8000000080000000;
  local_1018._8_4_ = auVar29._8_4_ ^ 0x80000000;
  local_1018._12_4_ = auVar29._12_4_ ^ 0x80000000;
  local_f88._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
  local_f88._8_4_ = auVar30._8_4_ ^ 0x80000000;
  local_f88._12_4_ = auVar30._12_4_ ^ 0x80000000;
  auVar33 = ZEXT1664(local_f88);
  uVar23 = auVar5._0_4_;
  local_f98._4_4_ = uVar23;
  local_f98._0_4_ = uVar23;
  local_f98._8_4_ = uVar23;
  local_f98._12_4_ = uVar23;
  auVar34 = ZEXT1664(local_f98);
  local_fe0 = ray;
  local_fe8 = uVar15;
  local_ff0 = uVar16;
  do {
    auVar5._4_4_ = fStack_fa4;
    auVar5._0_4_ = local_fa8;
    auVar5._8_4_ = fStack_fa0;
    auVar5._12_4_ = fStack_f9c;
    auVar28 = ZEXT1664(CONCAT412(fStack_ffc,CONCAT48(fStack_1000,CONCAT44(fStack_1004,local_1008))))
    ;
LAB_0149d5d2:
    do {
      if (pauVar18 == (undefined1 (*) [16])&local_f78) {
        return;
      }
      pauVar7 = pauVar18 + -1;
      pauVar18 = pauVar18 + -1;
    } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar7 + 8));
    uVar10 = *(ulong *)*pauVar18;
LAB_0149d5f8:
    if ((uVar10 & 8) == 0) {
      auVar24 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar15),auVar28._0_16_,auVar5
                               );
      auVar27 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar16),local_1018,local_fb8)
      ;
      auVar24 = vpmaxsd_avx(auVar24,auVar27);
      auVar27 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar19),auVar33._0_16_,
                                local_fc8);
      auVar27 = vpmaxsd_avx(auVar27,auVar34._0_16_);
      local_1028 = vpmaxsd_avx(auVar24,auVar27);
      auVar24 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar14),auVar28._0_16_,auVar5
                               );
      auVar27 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar20),local_1018,local_fb8)
      ;
      auVar24 = vpminsd_avx(auVar24,auVar27);
      auVar27 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar10 + 0x20 + (uVar19 ^ 0x10)),
                                auVar33._0_16_,local_fc8);
      auVar27 = vpminsd_avx(auVar27,auVar22);
      auVar24 = vpminsd_avx(auVar24,auVar27);
      auVar24 = vpcmpgtd_avx(local_1028,auVar24);
      iVar9 = vmovmskps_avx(auVar24);
      if (iVar9 != 0xf) {
        bVar8 = (byte)iVar9 ^ 0xf;
        uVar17 = uVar10 & 0xfffffffffffffff0;
        lVar6 = 0;
        for (uVar10 = (ulong)bVar8; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
          lVar6 = lVar6 + 1;
        }
        uVar10 = *(ulong *)(uVar17 + lVar6 * 8);
        uVar11 = bVar8 - 1 & (uint)bVar8;
        uVar12 = (ulong)uVar11;
        if (uVar11 != 0) {
          uVar3 = *(uint *)(local_1028 + lVar6 * 4);
          lVar6 = 0;
          for (; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
            lVar6 = lVar6 + 1;
          }
          uVar11 = uVar11 - 1 & uVar11;
          uVar13 = (ulong)uVar11;
          uVar12 = *(ulong *)(uVar17 + lVar6 * 8);
          uVar4 = *(uint *)(local_1028 + lVar6 * 4);
          if (uVar11 == 0) {
            if (uVar3 < uVar4) {
              *(ulong *)*pauVar18 = uVar12;
              *(uint *)(*pauVar18 + 8) = uVar4;
              pauVar18 = pauVar18 + 1;
            }
            else {
              *(ulong *)*pauVar18 = uVar10;
              *(uint *)(*pauVar18 + 8) = uVar3;
              uVar10 = uVar12;
              pauVar18 = pauVar18 + 1;
            }
          }
          else {
            auVar24._8_8_ = 0;
            auVar24._0_8_ = uVar10;
            auVar24 = vpunpcklqdq_avx(auVar24,ZEXT416(uVar3));
            auVar25._8_8_ = 0;
            auVar25._0_8_ = uVar12;
            auVar27 = vpunpcklqdq_avx(auVar25,ZEXT416(uVar4));
            lVar6 = 0;
            for (; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
              lVar6 = lVar6 + 1;
            }
            uVar11 = uVar11 - 1 & uVar11;
            uVar10 = (ulong)uVar11;
            auVar26._8_8_ = 0;
            auVar26._0_8_ = *(ulong *)(uVar17 + lVar6 * 8);
            auVar30 = vpunpcklqdq_avx(auVar26,ZEXT416(*(uint *)(local_1028 + lVar6 * 4)));
            auVar29 = vpcmpgtd_avx(auVar27,auVar24);
            if (uVar11 == 0) {
              auVar32 = vpshufd_avx(auVar29,0xaa);
              auVar29 = vblendvps_avx(auVar27,auVar24,auVar32);
              auVar24 = vblendvps_avx(auVar24,auVar27,auVar32);
              auVar27 = vpcmpgtd_avx(auVar30,auVar29);
              auVar32 = vpshufd_avx(auVar27,0xaa);
              auVar27 = vblendvps_avx(auVar30,auVar29,auVar32);
              auVar29 = vblendvps_avx(auVar29,auVar30,auVar32);
              auVar30 = vpcmpgtd_avx(auVar29,auVar24);
              auVar32 = vpshufd_avx(auVar30,0xaa);
              auVar30 = vblendvps_avx(auVar29,auVar24,auVar32);
              auVar24 = vblendvps_avx(auVar24,auVar29,auVar32);
              *pauVar18 = auVar24;
              pauVar18[1] = auVar30;
              uVar10 = auVar27._0_8_;
              pauVar18 = pauVar18 + 2;
            }
            else {
              lVar6 = 0;
              for (; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
                lVar6 = lVar6 + 1;
              }
              auVar31._8_8_ = 0;
              auVar31._0_8_ = *(ulong *)(uVar17 + lVar6 * 8);
              auVar25 = vpunpcklqdq_avx(auVar31,ZEXT416(*(uint *)(local_1028 + lVar6 * 4)));
              auVar32 = vpshufd_avx(auVar29,0xaa);
              auVar29 = vblendvps_avx(auVar27,auVar24,auVar32);
              auVar24 = vblendvps_avx(auVar24,auVar27,auVar32);
              auVar27 = vpcmpgtd_avx(auVar25,auVar30);
              auVar32 = vpshufd_avx(auVar27,0xaa);
              auVar27 = vblendvps_avx(auVar25,auVar30,auVar32);
              auVar30 = vblendvps_avx(auVar30,auVar25,auVar32);
              auVar32 = vpcmpgtd_avx(auVar30,auVar24);
              auVar25 = vpshufd_avx(auVar32,0xaa);
              auVar32 = vblendvps_avx(auVar30,auVar24,auVar25);
              auVar24 = vblendvps_avx(auVar24,auVar30,auVar25);
              auVar30 = vpcmpgtd_avx(auVar27,auVar29);
              auVar25 = vpshufd_avx(auVar30,0xaa);
              auVar30 = vblendvps_avx(auVar27,auVar29,auVar25);
              auVar27 = vblendvps_avx(auVar29,auVar27,auVar25);
              auVar29 = vpcmpgtd_avx(auVar32,auVar27);
              auVar25 = vpshufd_avx(auVar29,0xaa);
              auVar29 = vblendvps_avx(auVar32,auVar27,auVar25);
              auVar27 = vblendvps_avx(auVar27,auVar32,auVar25);
              *pauVar18 = auVar24;
              pauVar18[1] = auVar27;
              pauVar18[2] = auVar29;
              uVar10 = auVar30._0_8_;
              pauVar18 = pauVar18 + 3;
            }
            auVar28 = ZEXT1664(CONCAT412(fStack_ffc,
                                         CONCAT48(fStack_1000,CONCAT44(fStack_1004,local_1008))));
          }
        }
        goto LAB_0149d5f8;
      }
      goto LAB_0149d5d2;
    }
    local_fd0 = (ulong)((uint)uVar10 & 0xf) - 8;
    prim = (InstancePrimitive *)(uVar10 & 0xfffffffffffffff0);
    while (bVar21 = local_fd0 != 0, local_fd0 = local_fd0 + -1, bVar21) {
      InstanceIntersector1::intersect(&local_1029,ray,local_fd8,prim);
      auVar34 = ZEXT1664(local_f98);
      auVar33 = ZEXT1664(local_f88);
      prim = prim + 1;
      ray = local_fe0;
      uVar15 = local_fe8;
      uVar16 = local_ff0;
    }
    fVar1 = (ray->super_RayK<1>).tfar;
    auVar22._4_4_ = fVar1;
    auVar22._0_4_ = fVar1;
    auVar22._8_4_ = fVar1;
    auVar22._12_4_ = fVar1;
  } while( true );
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }